

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doc_comment.cc
# Opt level: O2

void google::protobuf::compiler::java::WriteServiceDocComment
               (Printer *printer,ServiceDescriptor *service,Options *options)

{
  char *pcVar1;
  bool bVar2;
  char *pcVar3;
  java *this;
  string_view text;
  string_view text_00;
  string_view input;
  SourceLocation location;
  Options local_b8;
  Options local_68;
  
  text._M_str = "/**\n";
  text._M_len = 4;
  io::Printer::Print<>(printer,text);
  Options::Options(&local_b8,options);
  location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
  location.leading_comments._M_string_length = 0;
  pcVar3 = (char *)0x0;
  location.leading_comments.field_2._M_local_buf[0] = '\0';
  location.trailing_comments._M_dataplus._M_p = (pointer)&location.trailing_comments.field_2;
  location.trailing_comments._M_string_length = 0;
  location.trailing_comments.field_2._M_local_buf[0] = '\0';
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  location.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar2 = ServiceDescriptor::GetSourceLocation(service,&location);
  if (bVar2) {
    Options::Options(&local_68,&local_b8);
    pcVar3 = (char *)0x0;
    WriteDocCommentBodyForLocation(printer,&location,&local_68,false);
    Options::~Options(&local_68);
  }
  SourceLocation::~SourceLocation(&location);
  Options::~Options(&local_b8);
  pcVar1 = (service->all_names_).payload_;
  this = (java *)(ulong)*(ushort *)(pcVar1 + 2);
  input._M_len = pcVar1 + ~(ulong)this;
  input._M_str = pcVar3;
  EscapeJavadoc_abi_cxx11_((string *)&location,this,input);
  text_00._M_str = " * Protobuf service {@code $fullname$}\n */\n";
  text_00._M_len = 0x2b;
  io::Printer::Print<char[9],std::__cxx11::string>
            (printer,text_00,(char (*) [9])"fullname",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&location);
  std::__cxx11::string::~string((string *)&location);
  return;
}

Assistant:

void WriteServiceDocComment(io::Printer* printer,
                            const ServiceDescriptor* service,
                            const Options options) {
  printer->Print("/**\n");
  WriteDocCommentBody(printer, service, options, /* kdoc */ false);
  printer->Print(
      " * Protobuf service {@code $fullname$}\n"
      " */\n",
      "fullname", EscapeJavadoc(service->full_name()));
}